

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O2

void __thiscall
MidiPlayerDialog::handlePlaybackTimeChanged
          (MidiPlayerDialog *this,quint64 currentNanos,quint32 totalSeconds)

{
  char cVar1;
  ulong uVar2;
  QArrayDataPointer<char16_t> QStack_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QString pos;
  QArrayDataPointer<char16_t> local_48;
  
  QString::QString((QString *)&local_48,"%1:%2 / %3:%4");
  uVar2 = currentNanos / 1000000000 & 0xffffffff;
  QString::arg((ulonglong)&QStack_a8,(int)&local_48,(int)(uVar2 / 0x3c),(QChar)0x2);
  QString::arg((ulonglong)&local_90,(int)&QStack_a8,(int)(uVar2 % 0x3c),(QChar)0x2);
  QString::arg((ulonglong)&local_78,(int)&local_90,totalSeconds / 0x3c,(QChar)0x2);
  QString::arg((ulonglong)&pos,(int)&local_78,totalSeconds % 0x3c,(QChar)0x2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QLabel::setText(*(QString **)(this->ui + 0x68));
  cVar1 = QAbstractSlider::isSliderDown();
  if (cVar1 == '\0') {
    this->sliderUpdating = true;
    QAbstractSlider::setSliderPosition((int)*(undefined8 *)(this->ui + 0x70));
    this->sliderUpdating = false;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&pos.d);
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackTimeChanged(quint64 currentNanos, quint32 totalSeconds) {
	quint32 currentSeconds = currentNanos / MasterClock::NANOS_PER_SECOND;
	QChar z = QChar('0');
	QString pos = QString("%1:%2 / %3:%4").arg(currentSeconds / 60, 2, 10, z).arg(currentSeconds % 60, 2, 10, z).arg(totalSeconds / 60, 2, 10, z).arg(totalSeconds % 60, 2, 10, z);
	ui->positionLabel->setText(pos);
	if (!ui->positionSlider->isSliderDown()) {
		sliderUpdating = true;
		ui->positionSlider->setSliderPosition((totalSeconds != 0) ? currentNanos / MasterClock::NANOS_PER_MILLISECOND / totalSeconds : 0);
		sliderUpdating = false;
	}
}